

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::word_start(Fl_Text_Buffer *this,int pos)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_14;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  local_14 = pos;
  while( true ) {
    bVar3 = false;
    if (0 < local_14) {
      uVar1 = char_at(this,local_14);
      iVar2 = isalnum(uVar1);
      bVar3 = true;
      if (iVar2 == 0) {
        uVar1 = char_at(this,local_14);
        bVar3 = uVar1 == 0x5f;
      }
    }
    if (!bVar3) break;
    local_14 = prev_char(this,local_14);
  }
  uVar1 = char_at(this,local_14);
  iVar2 = isalnum(uVar1);
  if ((iVar2 == 0) && (uVar1 = char_at(this,local_14), uVar1 != 0x5f)) {
    local_14 = next_char(this,local_14);
  }
  return local_14;
}

Assistant:

int Fl_Text_Buffer::word_start(int pos) const {
  // FIXME: character is ucs-4
  while (pos>0 && (isalnum(char_at(pos)) || char_at(pos) == '_')) {
    pos = prev_char(pos);
  } 
  // FIXME: character is ucs-4
  if (!(isalnum(char_at(pos)) || char_at(pos) == '_'))
    pos = next_char(pos);
  return pos;
}